

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

void __thiscall
netlist::NetlistPortDeclaration::~NetlistPortDeclaration(NetlistPortDeclaration *this)

{
  ~NetlistPortDeclaration(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

NetlistPortDeclaration(const ast::Symbol& symbol) :
        NetlistNode(NodeKind::PortDeclaration, symbol) {}